

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonSetFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  void *pvVar2;
  uchar *zJson;
  char *zFuncName;
  int local_68;
  int bIsSet;
  int bApnd;
  u32 i;
  char *zPath;
  JsonNode *pNode;
  JsonParse x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  x._40_8_ = argv;
  pvVar2 = sqlite3_user_data(ctx);
  if (0 < argc) {
    if ((argc & 1U) == 0) {
      zFuncName = "insert";
      if (pvVar2 != (void *)0x0) {
        zFuncName = "set";
      }
      jsonWrongNumArgs(ctx,zFuncName);
    }
    else {
      zJson = sqlite3_value_text(*(sqlite3_value **)x._40_8_);
      iVar1 = jsonParse((JsonParse *)&pNode,ctx,(char *)zJson);
      if (iVar1 == 0) {
        for (bIsSet = 1; (uint)bIsSet < (uint)argc; bIsSet = bIsSet + 2) {
          _bApnd = sqlite3_value_text(*(sqlite3_value **)(x._40_8_ + (ulong)(uint)bIsSet * 8));
          local_68 = 0;
          zPath = (char *)jsonLookup((JsonParse *)&pNode,(char *)_bApnd,&local_68,ctx);
          if ((char)x.aUp != '\0') {
            sqlite3_result_error_nomem(ctx);
            goto LAB_002728d7;
          }
          if (x.aUp._1_1_ != '\0') goto LAB_002728d7;
          if (((JsonNode *)zPath != (JsonNode *)0x0) && ((local_68 != 0 || (pvVar2 != (void *)0x0)))
             ) {
            ((JsonNode *)zPath)->jnFlags = ((JsonNode *)zPath)->jnFlags | 8;
            (((JsonNode *)zPath)->u).iAppend = bIsSet + 1;
          }
        }
        if ((*(byte *)(x._0_8_ + 1) & 8) == 0) {
          jsonReturnJson((JsonNode *)x._0_8_,ctx,(sqlite3_value **)x._40_8_);
        }
        else {
          sqlite3_result_value
                    (ctx,*(sqlite3_value **)(x._40_8_ + (ulong)*(uint *)(x._0_8_ + 8) * 8));
        }
LAB_002728d7:
        jsonParseReset((JsonParse *)&pNode);
      }
    }
  }
  return;
}

Assistant:

static void jsonSetFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse x;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  u32 i;
  int bApnd;
  int bIsSet = sqlite3_user_data(ctx)!=0;

  if( argc<1 ) return;
  if( (argc&1)==0 ) {
    jsonWrongNumArgs(ctx, bIsSet ? "set" : "insert");
    return;
  }
  if( jsonParse(&x, ctx, (const char*)sqlite3_value_text(argv[0])) ) return;
  assert( x.nNode );
  for(i=1; i<(u32)argc; i+=2){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    bApnd = 0;
    pNode = jsonLookup(&x, zPath, &bApnd, ctx);
    if( x.oom ){
      sqlite3_result_error_nomem(ctx);
      goto jsonSetDone;
    }else if( x.nErr ){
      goto jsonSetDone;
    }else if( pNode && (bApnd || bIsSet) ){
      testcase( pNode->eU!=0 && pNode->eU!=1 );
      assert( pNode->eU!=3 && pNode->eU!=5 );
      VVA( pNode->eU = 4 );
      pNode->jnFlags |= (u8)JNODE_REPLACE;
      pNode->u.iReplace = i + 1;
    }
  }
  if( x.aNode[0].jnFlags & JNODE_REPLACE ){
    assert( x.aNode[0].eU==4 );
    sqlite3_result_value(ctx, argv[x.aNode[0].u.iReplace]);
  }else{
    jsonReturnJson(x.aNode, ctx, argv);
  }
jsonSetDone:
  jsonParseReset(&x);
}